

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O3

int lib_atoi(char *str,size_t len)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  
  iVar2 = 0;
  if (len == 0) {
    iVar1 = 1;
    goto LAB_002266a3;
  }
  if (*str == '-') {
    iVar1 = -1;
LAB_00226679:
    len = len - 1;
    if (len == 0) goto LAB_002266a3;
    str = str + 1;
  }
  else {
    iVar1 = 1;
    if (*str == '+') goto LAB_00226679;
  }
  sVar3 = 0;
  iVar2 = 0;
  do {
    if (9 < (int)str[sVar3] - 0x30U) break;
    iVar2 = ((int)str[sVar3] - 0x30U) + iVar2 * 10;
    sVar3 = sVar3 + 1;
  } while (len != sVar3);
LAB_002266a3:
  return iVar1 * iVar2;
}

Assistant:

int lib_atoi(const char *str, size_t len)
{
    /* parse the sign, if present */
    int s = 1;
    if (len >= 1 && *str == '-')
        s = -1, ++str, --len;
    else if (len >= 1 && *str == '+')
        ++str, --len;

    /* scan digits */
    int acc;
    for (acc = 0 ; len > 0 && is_digit(*str) ;
         acc *= 10, acc += value_of_digit(*str), ++str, --len) ;

    /* apply the sign and return the result */
    return s * acc;
}